

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threading.cpp
# Opt level: O0

void * cinemo::threading::doInit(void *arg)

{
  iterator iVar1;
  iterator iVar2;
  EncodeParams *wp;
  void *arg_local;
  
  iVar1 = std::begin<std::vector<cinemo::LameWrapper*,std::allocator<cinemo::LameWrapper*>>>
                    ((vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> *)
                     ((long)arg + 0x10));
  iVar2 = std::end<std::vector<cinemo::LameWrapper*,std::allocator<cinemo::LameWrapper*>>>
                    ((vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> *)
                     ((long)arg + 0x10));
  std::
  for_each<__gnu_cxx::__normal_iterator<cinemo::LameWrapper**,std::vector<cinemo::LameWrapper*,std::allocator<cinemo::LameWrapper*>>>,cinemo::threading::doInit(void*)::__0>
            (iVar1._M_current,iVar2._M_current);
  return (void *)0x0;
}

Assistant:

static void* doInit(void* arg) {
			EncodeParams* wp = static_cast<EncodeParams*>(arg);
			for_each(begin(wp->works), end(wp->works),
				[&](LameWrapper* lw) {
				lw->init();
				});
			return static_cast<void*>(nullptr);
        }